

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

Hash __thiscall
Fossilize::ApplicationInfoFilter::Impl::get_bucket_hash
          (Impl *this,VkPhysicalDeviceProperties2 *props,VkApplicationInfo *info,void *device_pnext)

{
  char *pcVar1;
  bool bVar2;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *pvVar3;
  pointer ppVar4;
  reference pVVar5;
  Hash HVar6;
  VariantDependency *dep_5;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *__range2_1;
  VariantDependency *dep_4;
  iterator __end2;
  iterator __begin2;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *__range2;
  VariantDependency *dep_3;
  iterator __end3_3;
  iterator __begin3_3;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *__range3_3;
  VariantDependency *dep_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *__range3_2;
  allocator local_d9;
  key_type local_d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_b8;
  iterator itr_1;
  VariantDependency *dep_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *__range3_1;
  VariantDependency *dep;
  iterator __end3;
  iterator __begin3;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *__range3;
  allocator local_61;
  key_type local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_40;
  iterator itr;
  bool use_default_variant;
  Hasher h;
  void *device_pnext_local;
  VkApplicationInfo *info_local;
  VkPhysicalDeviceProperties2 *props_local;
  Impl *this_local;
  
  h.h = (Hash)device_pnext;
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd0);
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  ._M_cur._7_1_ = 1;
  Hasher::u32((Hasher *)&stack0xffffffffffffffd0,0);
  if ((info != (VkApplicationInfo *)0x0) && (info->pApplicationName != (char *)0x0)) {
    pcVar1 = info->pApplicationName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
         ::find(&this->application_infos,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    __range3 = (vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                *)std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                  ::end(&this->application_infos);
    bVar2 = std::__detail::operator!=
                      (&local_40,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        *)&__range3);
    if (bVar2) {
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
      ._M_cur._7_1_ = 0;
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                             *)&local_40);
      pvVar3 = &(ppVar4->second).variant_dependencies;
      __end3 = std::
               vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
               begin(pvVar3);
      dep = (VariantDependency *)
            std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ::end(pvVar3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                                         *)&dep), bVar2) {
        pVVar5 = __gnu_cxx::
                 __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                 ::operator*(&__end3);
        hash_variant((Hasher *)&stack0xffffffffffffffd0,*pVVar5,props,info,(void *)h.h,false);
        __gnu_cxx::
        __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
        ::operator++(&__end3);
      }
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                             *)&local_40);
      pvVar3 = &(ppVar4->second).variant_dependencies_feature;
      __end3_1 = std::
                 vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ::begin(pvVar3);
      dep_1 = (VariantDependency *)
              std::
              vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
              end(pvVar3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                                 *)&dep_1), bVar2) {
        itr_1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                   )__gnu_cxx::
                    __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                    ::operator*(&__end3_1);
        hash_variant((Hasher *)&stack0xffffffffffffffd0,
                     *(VariantDependency *)
                      &(((__node_type *)
                        itr_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        ._M_cur)->super__Hash_node_base)._M_nxt,props,info,(void *)h.h,true);
        __gnu_cxx::
        __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
        ::operator++(&__end3_1);
      }
    }
  }
  Hasher::u32((Hasher *)&stack0xffffffffffffffd0,0);
  if ((info != (VkApplicationInfo *)0x0) && (info->pEngineName != (char *)0x0)) {
    pcVar1 = info->pEngineName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,pcVar1,&local_d9);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
         ::find(&this->engine_infos,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    __range3_2 = (vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                  *)std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                    ::end(&this->engine_infos);
    bVar2 = std::__detail::operator!=
                      (&local_b8,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        *)&__range3_2);
    if (bVar2) {
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
      ._M_cur._7_1_ = 0;
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                             *)&local_b8);
      pvVar3 = &(ppVar4->second).variant_dependencies;
      __end3_2 = std::
                 vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ::begin(pvVar3);
      dep_2 = (VariantDependency *)
              std::
              vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
              end(pvVar3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                                 *)&dep_2), bVar2) {
        pVVar5 = __gnu_cxx::
                 __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                 ::operator*(&__end3_2);
        hash_variant((Hasher *)&stack0xffffffffffffffd0,*pVVar5,props,info,(void *)h.h,false);
        __gnu_cxx::
        __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
        ::operator++(&__end3_2);
      }
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                             *)&local_b8);
      pvVar3 = &(ppVar4->second).variant_dependencies_feature;
      __end3_3 = std::
                 vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ::begin(pvVar3);
      dep_3 = (VariantDependency *)
              std::
              vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
              end(pvVar3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                                 *)&dep_3), bVar2) {
        pVVar5 = __gnu_cxx::
                 __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                 ::operator*(&__end3_3);
        hash_variant((Hasher *)&stack0xffffffffffffffd0,*pVVar5,props,info,(void *)h.h,true);
        __gnu_cxx::
        __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
        ::operator++(&__end3_3);
      }
    }
  }
  if ((itr.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
       ._M_cur._7_1_ & 1) != 0) {
    __end2 = std::
             vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
             begin(&this->default_variant_dependencies);
    dep_4 = (VariantDependency *)
            std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ::end(&this->default_variant_dependencies);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                                       *)&dep_4), bVar2) {
      pVVar5 = __gnu_cxx::
               __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
               ::operator*(&__end2);
      hash_variant((Hasher *)&stack0xffffffffffffffd0,*pVVar5,props,info,(void *)h.h,false);
      __gnu_cxx::
      __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
               begin(&this->default_variant_dependencies_feature);
    dep_5 = (VariantDependency *)
            std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ::end(&this->default_variant_dependencies_feature);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
                               *)&dep_5), bVar2) {
      pVVar5 = __gnu_cxx::
               __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
               ::operator*(&__end2_1);
      hash_variant((Hasher *)&stack0xffffffffffffffd0,*pVVar5,props,info,(void *)h.h,true);
      __gnu_cxx::
      __normal_iterator<Fossilize::VariantDependency_*,_std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>_>
      ::operator++(&__end2_1);
    }
  }
  HVar6 = Hasher::get((Hasher *)&stack0xffffffffffffffd0);
  return HVar6;
}

Assistant:

Hash ApplicationInfoFilter::Impl::get_bucket_hash(const VkPhysicalDeviceProperties2 *props,
                                                  const VkApplicationInfo *info,
                                                  const void *device_pnext)
{
	Hasher h;
	bool use_default_variant = true;

	h.u32(0);
	if (info && info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
		{
			use_default_variant = false;
			for (auto &dep : itr->second.variant_dependencies)
				hash_variant(h, dep, props, info, device_pnext, false);
			for (auto &dep : itr->second.variant_dependencies_feature)
				hash_variant(h, dep, props, info, device_pnext, true);
		}
	}

	h.u32(0);
	if (info && info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
		{
			use_default_variant = false;
			for (auto &dep : itr->second.variant_dependencies)
				hash_variant(h, dep, props, info, device_pnext, false);
			for (auto &dep : itr->second.variant_dependencies_feature)
				hash_variant(h, dep, props, info, device_pnext, true);
		}
	}

	if (use_default_variant)
	{
		for (auto &dep : default_variant_dependencies)
			hash_variant(h, dep, props, info, device_pnext, false);
		for (auto &dep : default_variant_dependencies_feature)
			hash_variant(h, dep, props, info, device_pnext, true);
	}

	return h.get();
}